

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O2

pair<_f0276eba_> __thiscall
cppcms::impl::details::basic_map<$7159f324$>::insert(basic_map<_7159f324_> *this,value_type *entry)

{
  range_type *r;
  iterator p;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  pair<_f0276eba_> pVar2;
  
  rehash_if_needed(this);
  r = basic_map<std::__cxx11::string,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>>>>
      ::get<std::__cxx11::string>
                ((basic_map<std::__cxx11::string,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>>>>
                  *)this,&entry->first);
  p = basic_map<std::__cxx11::string,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>>>>
      ::find_in_range<std::__cxx11::string>
                ((basic_map<std::__cxx11::string,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::list<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator,std::allocator<cppcms::impl::hash_map<std::__cxx11::string,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container,cppcms::impl::string_hash,cppcms::impl::string_equal,std::allocator<std::pair<std::__cxx11::string_const,cppcms::impl::mem_cache<cppcms::impl::thread_settings>::container>>>::iterator>>>>>
                  *)this,r,&entry->first);
  if (p == (iterator)0x0) {
    p = allocate(this,entry);
    if (r->second == (container *)0x0) {
      intrusive_list<$b487a5d2$>::push_back(&this->list_,p);
      r->first = p;
      uVar1 = extraout_RDX_00;
    }
    else {
      intrusive_list<$b487a5d2$>::insert_after(&this->list_,p,r->second);
      uVar1 = extraout_RDX;
    }
    r->second = p;
    this->size_ = this->size_ + 1;
    uVar1 = CONCAT71((int7)((ulong)uVar1 >> 8),1);
  }
  else {
    uVar1 = 0;
  }
  pVar2._8_8_ = uVar1;
  pVar2.first = p;
  return pVar2;
}

Assistant:

std::pair<iterator,bool> insert(value_type const &entry)
	{
		std::pair<iterator,bool> r(iterator(),false);
		rehash_if_needed();
		range_type &range=get(entry.first);
		iterator p = find_in_range(range,entry.first);
		if(p) {
			r.first = p;
			return r;
		}
		p = allocate(entry);
		if(range.second == 0) {
			list_.push_back(p);
			range.first = range.second = p;
		}
		else {
			list_.insert_after(p,range.second);
			range.second = p;
		}

		r.first = p;
		r.second  = true;
		size_ ++;
		return r;
	}